

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

void __thiscall
Eigen::Matrix<double,-1,1,0,-1,1>::
Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
          (Matrix<double,_1,1,0,_1,1> *this,
          Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
          *x)

{
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)x);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
    explicit Matrix(const T& x)
    {
      Base::_check_template_params();
      Base::template _init1<T>(x);
    }